

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O0

void * __thiscall
cookmem::CachedArena<cookmem::MallocArena>::getSegment
          (CachedArena<cookmem::MallocArena> *this,size_t *size)

{
  int iVar1;
  undefined4 extraout_var;
  void *seg;
  size_t *size_local;
  CachedArena<cookmem::MallocArena> *this_local;
  
  iVar1 = PtrAVLTree::remove(&this->m_tree,(char *)size);
  this_local = (CachedArena<cookmem::MallocArena> *)CONCAT44(extraout_var,iVar1);
  if (this_local == (CachedArena<cookmem::MallocArena> *)0x0) {
    this_local = (CachedArena<cookmem::MallocArena> *)MallocArena::getSegment(this->m_arena,size);
  }
  return this_local;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        void* seg = m_tree.remove(size);
        if (seg)
        {
            return seg;
        }
        return m_arena.getSegment(size);
    }